

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

string * vkt::pipeline::anon_unknown_0::getColorStr<float>
                   (string *__return_storage_ptr__,float *data,int numComponents,bool isUint,
                   bool isSint)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_1d0;
  int local_1b4;
  int local_1b0;
  int i_1;
  int i;
  ostringstream local_1a0 [8];
  ostringstream str;
  int maxIndex;
  bool isSint_local;
  bool isUint_local;
  int numComponents_local;
  float *data_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  if (isUint) {
    local_1d0 = "u";
  }
  else {
    local_1d0 = "";
    if (isSint) {
      local_1d0 = "i";
    }
  }
  poVar1 = std::operator<<((ostream *)local_1a0,local_1d0);
  std::operator<<(poVar1,"vec4(");
  for (local_1b0 = 0; local_1b4 = numComponents, local_1b0 < numComponents;
      local_1b0 = local_1b0 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(local_1a0,data[local_1b0]);
    pcVar2 = "";
    if (local_1b0 < 3) {
      pcVar2 = ", ";
    }
    std::operator<<(poVar1,pcVar2);
  }
  for (; local_1b4 < 4; local_1b4 = local_1b4 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(local_1a0,(uint)(local_1b4 == 3));
    pcVar2 = "";
    if (local_1b4 < 3) {
      pcVar2 = ", ";
    }
    std::operator<<(poVar1,pcVar2);
  }
  std::operator<<((ostream *)local_1a0,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string getColorStr (const T* data, int numComponents, const bool isUint, const bool isSint)
{
	const int maxIndex = 3;  // 4 components max

	std::ostringstream str;
	str << (isUint ? "u" : isSint ? "i" : "") << "vec4(";

	for (int i = 0; i < numComponents; ++i)
	{
		str << data[i]
			<< (i < maxIndex ? ", " : "");
	}

	for (int i = numComponents; i < maxIndex + 1; ++i)
	{
		str << (i == maxIndex ? 1 : 0)
			<< (i <  maxIndex ? ", " : "");
	}

	str << ")";
	return str.str();
}